

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

iterator * __thiscall
ft::deque<int,_ft::allocator<int>_>::erase
          (iterator *__return_storage_ptr__,deque<int,_ft::allocator<int>_> *this,iterator *first,
          iterator *last)

{
  undefined1 local_148 [8];
  deque<int,_ft::allocator<int>_> tmp;
  dequeIterator<int,_64UL> local_a8;
  dequeIterator<int,_64UL> local_80;
  undefined1 local_58 [8];
  iterator it;
  
  dequeIterator<int,_64UL>::dequeIterator((dequeIterator<int,_64UL> *)&tmp.field_0x70,last);
  dequeIterator<int,_64UL>::dequeIterator(&local_a8,&this->m_finish);
  deque<int,ft::allocator<int>>::deque<ft::dequeIterator<int,64ul>>
            ((deque<int,ft::allocator<int>> *)local_148,(dequeIterator<int,_64UL> *)&tmp.field_0x70,
             &local_a8,(allocator_type *)local_58,(type *)0x0);
  while( true ) {
    dequeIterator<int,_64UL>::dequeIterator((dequeIterator<int,_64UL> *)local_58,&this->m_finish);
    if ((_func_int **)first->m_cur == it._vptr_dequeIterator) break;
    pop_back(this);
  }
  dequeIterator<int,_64UL>::dequeIterator
            ((dequeIterator<int,_64UL> *)local_58,(dequeIterator<int,_64UL> *)local_148);
  while( true ) {
    dequeIterator<int,_64UL>::dequeIterator
              (&local_80,(dequeIterator<int,_64UL> *)&tmp.m_start.m_node);
    if (it._vptr_dequeIterator == (_func_int **)local_80.m_cur) break;
    push_back(this,(value_type_conflict *)it._vptr_dequeIterator);
    it._vptr_dequeIterator = (_func_int **)((long)it._vptr_dequeIterator + 4);
    if (it._vptr_dequeIterator == (_func_int **)it.m_first) {
      it._vptr_dequeIterator = *(_func_int ***)(it.m_last + 2);
      it.m_first = (pointer)(it._vptr_dequeIterator + 0x20);
      it.m_cur = (pointer)it._vptr_dequeIterator;
      it.m_last = it.m_last + 2;
    }
  }
  dequeIterator<int,_64UL>::dequeIterator(__return_storage_ptr__,first);
  ~deque((deque<int,_ft::allocator<int>_> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

iterator	erase(iterator first, iterator last) {
		deque	tmp(last, this->end());
		while (first != this->end())
			this->pop_back();
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
		return first;
	}